

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O3

HdlcAnalyzer * __thiscall
HdlcAnalyzer::CreateFrame
          (HdlcAnalyzer *this,U8 mType,U64 mStartingSampleInclusive,U64 mEndingSampleInclusive,
          U64 mData1,U64 mData2,U8 mFlags)

{
  undefined7 in_stack_00000009;
  undefined1 in_stack_00000010;
  
  Frame::Frame((Frame *)this);
  *(U64 *)this = mEndingSampleInclusive;
  *(U64 *)&this->field_0x8 = mData1;
  *(char *)&this->mHdlc = (char)mStartingSampleInclusive;
  (this->mSettings)._M_ptr = (HdlcAnalyzerSettings *)mData2;
  (this->mResults)._M_ptr = (HdlcAnalyzerResults *)CONCAT71(in_stack_00000009,mFlags);
  *(undefined1 *)((long)&this->mHdlc + 1) = in_stack_00000010;
  return this;
}

Assistant:

Frame HdlcAnalyzer::CreateFrame( U8 mType, U64 mStartingSampleInclusive, U64 mEndingSampleInclusive, U64 mData1, U64 mData2,
                                 U8 mFlags ) const
{
    Frame frame;
    frame.mStartingSampleInclusive = mStartingSampleInclusive;
    frame.mEndingSampleInclusive = mEndingSampleInclusive;
    frame.mType = mType;
    frame.mData1 = mData1;
    frame.mData2 = mData2;
    frame.mFlags = mFlags;
    return frame;
}